

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O0

void draw_down_arrow(int left,int top,int width,int height,Am_Widget_Look look,bool depressed,
                    bool active,bool option,Computed_Colors_Record *color_rec,Am_Drawonable *draw)

{
  uint uVar1;
  am_rect arrow_rect_00;
  am_rect arrow_rect_01;
  uint uVar2;
  uint uVar3;
  Am_Style *local_e0;
  Am_Style *local_d8;
  Am_Style *local_d0;
  Am_Style *local_c8;
  Am_Style *local_c0;
  Am_Style local_90;
  Am_Style fill_style;
  int y;
  int a_height;
  int a_width;
  int a_left;
  int a_top;
  int bottom;
  int right;
  int center_x;
  Am_Style line2;
  Am_Style local_40;
  Am_Style line1;
  Am_Style fill1;
  am_rect arrow_rect;
  bool option_local;
  bool active_local;
  bool depressed_local;
  int height_local;
  int width_local;
  int top_local;
  int left_local;
  Am_Widget_Look look_local;
  
  am_rect::am_rect((am_rect *)&fill1,left,top,width,height);
  if (look.value == Am_MOTIF_LOOK_val) {
    if (depressed) {
      local_c0 = &color_rec->data->background_style;
    }
    else {
      local_c0 = &color_rec->data->foreground_style;
    }
    Am_Style::Am_Style(&line1,local_c0);
    if (depressed) {
      local_c8 = &color_rec->data->shadow_style;
    }
    else {
      local_c8 = &color_rec->data->highlight_style;
    }
    Am_Style::Am_Style(&local_40,local_c8);
    if (depressed) {
      local_d0 = &color_rec->data->highlight_style;
    }
    else {
      local_d0 = &color_rec->data->shadow_style;
    }
    Am_Style::Am_Style((Am_Style *)&right,local_d0);
    uVar2 = left + width / 2;
    uVar3 = left + -1 + width;
    uVar1 = top + -1 + height;
    (*draw->_vptr_Am_Drawonable[0x2a])
              (draw,&local_40,&Am_No_Style,(ulong)uVar2,(ulong)uVar1,(ulong)(left + 1),top,uVar3,top
               ,0);
    (*draw->_vptr_Am_Drawonable[0x28])
              (draw,&right,(ulong)uVar3,(ulong)(uint)top,(ulong)uVar2,(ulong)uVar1,0);
    (*draw->_vptr_Am_Drawonable[0x2a])
              (draw,&local_40,&line1,(ulong)uVar2,(ulong)(uVar1 - 1),(ulong)(left + 2),top + 1,
               uVar3 - 1,top + 1,0);
    (*draw->_vptr_Am_Drawonable[0x28])
              (draw,&right,(ulong)(uVar3 - 1),(ulong)(top + 1),(ulong)uVar2,(ulong)(uVar1 - 1),0);
    Am_Style::~Am_Style((Am_Style *)&right);
    Am_Style::~Am_Style(&local_40);
    Am_Style::~Am_Style(&line1);
  }
  else if (look.value == Am_WINDOWS_LOOK_val) {
    arrow_rect_01._8_8_ = arrow_rect._0_8_;
    arrow_rect_01._0_8_ = fill1.data;
    draw_win_arrow_box(arrow_rect_01,depressed,option,color_rec,draw);
    a_width = 7;
    if (((depressed ^ 0xffU) & 1) != 0) {
      a_width = 6;
    }
    a_height = 5;
    if (((depressed ^ 0xffU) & 1) != 0) {
      a_height = 4;
    }
    y = 6;
    fill_style.data._4_4_ = 4;
    if (0x10 < height) {
      a_width = (height + -0x10) / 2 + a_width;
    }
    for (fill_style.data._0_4_ = 0; (int)fill_style.data < fill_style.data._4_4_;
        fill_style.data._0_4_ = (int)fill_style.data + 1) {
      (*draw->_vptr_Am_Drawonable[0x28])
                (draw,&Am_Black,(ulong)(uint)(left + a_height),
                 (ulong)(uint)(top + a_width + (int)fill_style.data),
                 (ulong)(uint)(left + a_height + y),
                 (ulong)(uint)(top + a_width + (int)fill_style.data),0);
      a_height = a_height + 1;
      y = y + -2;
    }
  }
  else {
    if (look.value != Am_MACINTOSH_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    if (active) {
      if (depressed) {
        local_d8 = &Am_Black;
      }
      else {
        local_d8 = &color_rec->data->background_style;
      }
      local_e0 = local_d8;
    }
    else {
      local_e0 = &color_rec->data->foreground_style;
    }
    Am_Style::Am_Style(&local_90,local_e0);
    arrow_rect_00._8_8_ = arrow_rect._0_8_;
    arrow_rect_00._0_8_ = fill1.data;
    draw_mac_arrow_box(arrow_rect_00,active,color_rec,draw);
    uVar3 = top + 7;
    (*draw->_vptr_Am_Drawonable[0x2b])
              (draw,&color_rec->data->shadow_style,&local_90,(ulong)(left + 2U),(ulong)uVar3,
               (ulong)(left + 0xc),uVar3,left + 7,top + 0xc,left + 2U,uVar3,0);
    (*draw->_vptr_Am_Drawonable[0x2b])
              (draw,&color_rec->data->shadow_style,&local_90,(ulong)(left + 5),(ulong)(top + 7U),
               (ulong)(left + 5),top + 3,left + 9,top + 3,left + 9,top + 7U,0);
    (*draw->_vptr_Am_Drawonable[0x28])
              (draw,&local_90,(ulong)(left + 6),(ulong)(top + 7),(ulong)(left + 8),(ulong)(top + 7),
               0);
    Am_Style::~Am_Style(&local_90);
  }
  return;
}

Assistant:

void
draw_down_arrow(int left, int top, int width, int height, Am_Widget_Look look,
                bool depressed, bool active, bool option,
                const Computed_Colors_Record &color_rec, Am_Drawonable *draw)
{
  am_rect arrow_rect(left, top, width, height);
  switch (look.value) {
  case Am_MOTIF_LOOK_val: {
    const Am_Style fill1(depressed ? color_rec.data->background_style
                                   : color_rec.data->foreground_style);
    const Am_Style line1(depressed ? color_rec.data->shadow_style
                                   : color_rec.data->highlight_style);
    const Am_Style line2(depressed ? color_rec.data->highlight_style
                                   : color_rec.data->shadow_style);

    int center_x = left + width / 2;
    int right = left + width - 1;
    int bottom = top + height - 1;

    //left line
    draw->Draw_2_Lines(line1, Am_No_Style, center_x, bottom, left + 1, top,
                       right, top);
    //right line
    draw->Draw_Line(line2, right, top, center_x, bottom);
    //left line
    draw->Draw_2_Lines(line1, fill1, center_x, bottom - 1, left + 2, top + 1,
                       right - 1, top + 1);
    //right line
    draw->Draw_Line(line2, right - 1, top + 1, center_x, bottom - 1);
    break;
  }

  case Am_WINDOWS_LOOK_val: {
    draw_win_arrow_box(arrow_rect, depressed, option, color_rec, draw);

    int a_top = !depressed ? 6 : 7, a_left = !depressed ? 4 : 5,
        a_width = 6, // 7 - 1, because extra pixel is drawn at end of line
        a_height = 4;

    if (height > 16) // so that the option button arrow draw correctly
      a_top += (height - 16) / 2;

    for (int y = 0; y < a_height; y++) {
      draw->Draw_Line(Am_Black, left + a_left, top + a_top + y,
                      left + a_left + a_width, top + a_top + y);
      a_left++;
      a_width -= 2;
    }
    break;
  }

  case Am_MACINTOSH_LOOK_val: {
    Am_Style fill_style =
        (active) ? (!depressed ? color_rec.data->background_style : Am_Black)
                 : color_rec.data->foreground_style;

    draw_mac_arrow_box(arrow_rect, active, color_rec, draw);
    draw->Draw_3_Lines(color_rec.data->shadow_style, fill_style, left + 2,
                       top + 7, left + 12, top + 7, left + 7, top + 12,
                       left + 2, top + 7);
    draw->Draw_3_Lines(color_rec.data->shadow_style, fill_style, left + 5,
                       top + 7, left + 5, top + 3, left + 9, top + 3, left + 9,
                       top + 7);
    draw->Draw_Line(fill_style, left + 6, top + 7, left + 8, top + 7);
    break;
  }

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
}